

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::GatherBase::VerifyCompute(GatherBase *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  Vector<float,_4> *this_00;
  float *pfVar5;
  Vector<float,_4> local_30;
  Vector<float,_4> *local_20;
  Vec4 *data;
  GatherBase *this_local;
  
  data = (Vec4 *)this;
  this_00 = (Vector<float,_4> *)
            glu::CallLogWrapper::glMapBufferRange
                      (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                       0x90d2,0,0x10,1);
  local_20 = this_00;
  tcu::Vector<float,_4>::Vector(&local_30,0.0,1.0,0.0,1.0);
  bVar4 = tcu::Vector<float,_4>::operator!=(this_00,&local_30);
  if (bVar4) {
    pfVar5 = tcu::Vector<float,_4>::x(local_20);
    fVar1 = *pfVar5;
    pfVar5 = tcu::Vector<float,_4>::y(local_20);
    fVar2 = *pfVar5;
    pfVar5 = tcu::Vector<float,_4>::z(local_20);
    fVar3 = *pfVar5;
    pfVar5 = tcu::Vector<float,_4>::w(local_20);
    anon_unknown_0::Output
              ("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f",(double)fVar1,(double)fVar2,
               (double)fVar3,(double)*pfVar5);
    this_local = (GatherBase *)&DAT_ffffffffffffffff;
  }
  else {
    this_local = (GatherBase *)0x0;
  }
  return (long)this_local;
}

Assistant:

virtual long VerifyCompute()
	{
		Vec4* data;
		data = static_cast<Vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Vec4), GL_MAP_READ_BIT));
		if (data[0] != Vec4(0, 1, 0, 1))
		{
			Output("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f", data[0].x(), data[0].y(), data[0].z(),
				   data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}